

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets_smart.cpp
# Opt level: O0

void read_random(void)

{
  bool bVar1;
  long *plVar2;
  double local_218;
  double r;
  ifstream ifi_r;
  
  std::ifstream::ifstream(&r,"random.txt",8);
  while( true ) {
    plVar2 = (long *)std::istream::operator>>((istream *)&r,&local_218);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::vector<double,_std::allocator<double>_>::push_back(&random_,&local_218);
  }
  std::ifstream::~ifstream(&r);
  return;
}

Assistant:

void read_random() {
	ifstream ifi_r("random.txt");
	double r;
	while(ifi_r >> r)random_.push_back(r);
}